

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  undefined4 in_EDX;
  exception *in_RDI;
  int in_stack_0000001c;
  buffer *in_stack_00000020;
  string_view in_stack_00000028;
  memory_buffer outbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  string local_278 [16];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  allocator<char> local_231 [541];
  undefined4 local_14;
  
  local_14 = in_EDX;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__spdlog_ex_0015fd88;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (allocator<char> *)in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator(local_231);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)CONCAT44(local_14,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd58);
  fmt::v5::format_system_error(in_stack_00000020,in_stack_0000001c,in_stack_00000028);
  fmt::v5::to_string<char,500ul>(in_stack_fffffffffffffd98);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_278);
  std::__cxx11::string::~string(local_278);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(local_14,in_stack_fffffffffffffd60));
  return;
}

Assistant:

spdlog_ex(const std::string &msg, int last_errno)
    {
        fmt::memory_buffer outbuf;
        fmt::format_system_error(outbuf, last_errno, msg);
        msg_ = fmt::to_string(outbuf);
    }